

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string<unsigned_long>(string *__return_storage_ptr__,unsigned_long *value)

{
  unsigned_long *in_RDX;
  unsigned_long *value_local;
  
  string_maker<unsigned_long>::to_string_abi_cxx11_
            (__return_storage_ptr__,(string_maker<unsigned_long> *)value,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}